

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

int cmcmd_cmake_ninja_dyndep(const_iterator argBeg,const_iterator argEnd)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  ulong uVar3;
  char *pcVar4;
  char *m3;
  Value *pVVar5;
  pointer this;
  cmGlobalNinjaGenerator *pcVar6;
  const_iterator cVar7;
  allocator local_881;
  string local_880;
  auto_ptr<cmGlobalNinjaGenerator> local_860;
  auto_ptr<cmGlobalNinjaGenerator> ggd;
  cmake cm;
  SelfType local_570;
  _Base_ptr local_560;
  undefined1 local_558;
  undefined1 local_550 [8];
  const_iterator i;
  Value *tdi_linked_target_dirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linked_target_dirs;
  string module_dir;
  string dir_top_src;
  string dir_top_bld;
  string dir_cur_src;
  string dir_cur_bld;
  undefined1 local_460 [8];
  Reader reader;
  ifstream tdif;
  Value *tdi;
  Value tdio;
  string local_110 [32];
  string local_f0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  string *arg;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  const_iterator a;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_ddis;
  string arg_tdi;
  string arg_dd;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_full;
  const_iterator argEnd_local;
  const_iterator argBeg_local;
  
  arg_full.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = argEnd._M_current;
  cmSystemTools::HandleResponseFile
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38,argBeg,argEnd);
  std::__cxx11::string::string((string *)(arg_tdi.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &arg_ddis.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&a);
  local_b0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_a8,&local_b0);
  while( true ) {
    arg = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38);
    bVar1 = __gnu_cxx::operator!=
                      (&local_a8,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&arg);
    if (!bVar1) break;
    local_c0 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_a8);
    bVar1 = cmHasLiteralPrefix<std::__cxx11::string,7ul>(local_c0,(char (*) [7])0xbbf65a);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)local_f0,(ulong)local_c0);
      std::__cxx11::string::operator=
                ((string *)
                 &arg_ddis.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,local_f0);
      std::__cxx11::string::~string(local_f0);
    }
    else {
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,6ul>(local_c0,(char (*) [6])0xbbefcd);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)local_110,(ulong)local_c0);
        std::__cxx11::string::operator=((string *)(arg_tdi.field_2._M_local_buf + 8),local_110);
        std::__cxx11::string::~string(local_110);
      }
      else {
        bVar1 = cmHasLiteralPrefix<std::__cxx11::string,3ul>(local_c0,(char (*) [3])0xb99abc);
        if ((bVar1) ||
           (bVar1 = cmHasLiteralSuffix<std::__cxx11::string,5ul>(local_c0,(char (*) [5])".ddi"),
           !bVar1)) {
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error
                    ("-E cmake_ninja_dyndep unknown argument: ",pcVar4,(char *)0x0,(char *)0x0);
          argBeg_local._M_current._4_4_ = 1;
          tdio.limit_._4_4_ = 1;
          goto LAB_00814e99;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&a,local_c0);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_a8);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    cmSystemTools::Error
              ("-E cmake_ninja_dyndep requires value for --tdi=",(char *)0x0,(char *)0x0,(char *)0x0
              );
    argBeg_local._M_current._4_4_ = 1;
    tdio.limit_._4_4_ = 1;
    goto LAB_00814e99;
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    cmSystemTools::Error
              ("-E cmake_ninja_dyndep requires value for --dd=",(char *)0x0,(char *)0x0,(char *)0x0)
    ;
    argBeg_local._M_current._4_4_ = 1;
    tdio.limit_._4_4_ = 1;
    goto LAB_00814e99;
  }
  Json::Value::Value((Value *)&tdi,nullValue);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(&reader.features_,pcVar4,_Var2);
  Json::Reader::Reader((Reader *)local_460);
  bVar1 = Json::Reader::parse((Reader *)local_460,(istream *)&reader.features_,(Value *)&tdi,false);
  if (!bVar1) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Json::Reader::getFormattedErrorMessages_abi_cxx11_
              ((string *)((long)&dir_cur_bld.field_2 + 8),(Reader *)local_460);
    m3 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse ",pcVar4,m3,(char *)0x0);
    std::__cxx11::string::~string((string *)(dir_cur_bld.field_2._M_local_buf + 8));
    argBeg_local._M_current._4_4_ = 1;
  }
  tdio.limit_._5_3_ = 0;
  tdio.limit_._4_1_ = !bVar1;
  Json::Reader::~Reader((Reader *)local_460);
  std::ifstream::~ifstream(&reader.features_);
  if (tdio.limit_._4_4_ == 0) {
    pVVar5 = Json::Value::operator[]((Value *)&tdi,"dir-cur-bld");
    Json::Value::asString_abi_cxx11_((string *)((long)&dir_cur_src.field_2 + 8),pVVar5);
    pVVar5 = Json::Value::operator[]((Value *)&tdi,"dir-cur-src");
    Json::Value::asString_abi_cxx11_((string *)((long)&dir_top_bld.field_2 + 8),pVVar5);
    pVVar5 = Json::Value::operator[]((Value *)&tdi,"dir-top-bld");
    Json::Value::asString_abi_cxx11_((string *)((long)&dir_top_src.field_2 + 8),pVVar5);
    pVVar5 = Json::Value::operator[]((Value *)&tdi,"dir-top-src");
    Json::Value::asString_abi_cxx11_((string *)((long)&module_dir.field_2 + 8),pVVar5);
    pVVar5 = Json::Value::operator[]((Value *)&tdi,"module-dir");
    Json::Value::asString_abi_cxx11_
              ((string *)
               &linked_target_dirs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pVVar5);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::operator+=
                ((string *)
                 &linked_target_dirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"/");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&tdi_linked_target_dirs);
    i.super_ValueIteratorBase._8_8_ = Json::Value::operator[]((Value *)&tdi,"linked-target-dirs");
    bVar1 = Json::Value::isArray((Value *)i.super_ValueIteratorBase._8_8_);
    if (bVar1) {
      cVar7 = Json::Value::begin((Value *)i.super_ValueIteratorBase._8_8_);
      local_560 = (_Base_ptr)cVar7.super_ValueIteratorBase.current_._M_node;
      local_558 = cVar7.super_ValueIteratorBase.isNull_;
      local_550 = (undefined1  [8])local_560;
      i.super_ValueIteratorBase.current_._M_node._0_1_ = local_558;
      while( true ) {
        cVar7 = Json::Value::end((Value *)i.super_ValueIteratorBase._8_8_);
        local_570.current_ = cVar7.super_ValueIteratorBase.current_._M_node;
        local_570.isNull_ = cVar7.super_ValueIteratorBase.isNull_;
        bVar1 = Json::ValueIteratorBase::operator!=((ValueIteratorBase *)local_550,&local_570);
        if (!bVar1) break;
        this = Json::ValueConstIterator::operator->((ValueConstIterator *)local_550);
        Json::Value::asString_abi_cxx11_((string *)&cm.Debugger,this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&tdi_linked_target_dirs,(value_type *)&cm.Debugger);
        std::__cxx11::string::~string((string *)&cm.Debugger);
        Json::ValueConstIterator::operator++((ValueConstIterator *)local_550);
      }
    }
    cmake::cmake((cmake *)&ggd,RoleInternal);
    cmake::SetHomeDirectory((cmake *)&ggd,(string *)((long)&module_dir.field_2 + 8));
    cmake::SetHomeOutputDirectory((cmake *)&ggd,(string *)((long)&dir_top_src.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_880,"Ninja",&local_881);
    pcVar6 = (cmGlobalNinjaGenerator *)cmake::CreateGlobalGenerator((cmake *)&ggd,&local_880);
    ::cm::auto_ptr<cmGlobalNinjaGenerator>::auto_ptr(&local_860,pcVar6);
    std::__cxx11::string::~string((string *)&local_880);
    std::allocator<char>::~allocator((allocator<char> *)&local_881);
    pcVar6 = ::cm::auto_ptr<cmGlobalNinjaGenerator>::get(&local_860);
    if (pcVar6 == (cmGlobalNinjaGenerator *)0x0) {
LAB_00814d24:
      argBeg_local._M_current._4_4_ = 1;
    }
    else {
      pcVar6 = ::cm::auto_ptr<cmGlobalNinjaGenerator>::operator->(&local_860);
      bVar1 = cmGlobalNinjaGenerator::WriteDyndepFile
                        (pcVar6,(string *)((long)&module_dir.field_2 + 8),
                         (string *)((long)&dir_top_src.field_2 + 8),
                         (string *)((long)&dir_top_bld.field_2 + 8),
                         (string *)((long)&dir_cur_src.field_2 + 8),
                         (string *)((long)&arg_tdi.field_2 + 8),
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&a,(string *)
                               &linked_target_dirs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&tdi_linked_target_dirs);
      if (!bVar1) goto LAB_00814d24;
      argBeg_local._M_current._4_4_ = 0;
    }
    tdio.limit_._4_4_ = 1;
    ::cm::auto_ptr<cmGlobalNinjaGenerator>::~auto_ptr(&local_860);
    cmake::~cmake((cmake *)&ggd);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&tdi_linked_target_dirs);
    std::__cxx11::string::~string
              ((string *)
               &linked_target_dirs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)(module_dir.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(dir_top_src.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(dir_top_bld.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(dir_cur_src.field_2._M_local_buf + 8));
  }
  Json::Value::~Value((Value *)&tdi);
LAB_00814e99:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&a);
  std::__cxx11::string::~string
            ((string *)
             &arg_ddis.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(arg_tdi.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return argBeg_local._M_current._4_4_;
}

Assistant:

int cmcmd_cmake_ninja_dyndep(std::vector<std::string>::const_iterator argBeg,
                             std::vector<std::string>::const_iterator argEnd)
{
  std::vector<std::string> arg_full =
    cmSystemTools::HandleResponseFile(argBeg, argEnd);

  std::string arg_dd;
  std::string arg_tdi;
  std::vector<std::string> arg_ddis;
  for (std::vector<std::string>::const_iterator a = arg_full.begin();
       a != arg_full.end(); ++a) {
    std::string const& arg = *a;
    if (cmHasLiteralPrefix(arg, "--tdi=")) {
      arg_tdi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--dd=")) {
      arg_dd = arg.substr(5);
    } else if (!cmHasLiteralPrefix(arg, "--") &&
               cmHasLiteralSuffix(arg, ".ddi")) {
      arg_ddis.push_back(arg);
    } else {
      cmSystemTools::Error("-E cmake_ninja_dyndep unknown argument: ",
                           arg.c_str());
      return 1;
    }
  }
  if (arg_tdi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --tdi=");
    return 1;
  }
  if (arg_dd.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --dd=");
    return 1;
  }

  Json::Value tdio;
  Json::Value const& tdi = tdio;
  {
    cmsys::ifstream tdif(arg_tdi.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (!reader.parse(tdif, tdio, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse ",
                           arg_tdi.c_str(),
                           reader.getFormattedErrorMessages().c_str());
      return 1;
    }
  }

  std::string const dir_cur_bld = tdi["dir-cur-bld"].asString();
  std::string const dir_cur_src = tdi["dir-cur-src"].asString();
  std::string const dir_top_bld = tdi["dir-top-bld"].asString();
  std::string const dir_top_src = tdi["dir-top-src"].asString();
  std::string module_dir = tdi["module-dir"].asString();
  if (!module_dir.empty()) {
    module_dir += "/";
  }
  std::vector<std::string> linked_target_dirs;
  Json::Value const& tdi_linked_target_dirs = tdi["linked-target-dirs"];
  if (tdi_linked_target_dirs.isArray()) {
    for (Json::Value::const_iterator i = tdi_linked_target_dirs.begin();
         i != tdi_linked_target_dirs.end(); ++i) {
      linked_target_dirs.push_back(i->asString());
    }
  }

  cmake cm(cmake::RoleInternal);
  cm.SetHomeDirectory(dir_top_src);
  cm.SetHomeOutputDirectory(dir_top_bld);
  CM_AUTO_PTR<cmGlobalNinjaGenerator> ggd(
    static_cast<cmGlobalNinjaGenerator*>(cm.CreateGlobalGenerator("Ninja")));
  if (!ggd.get() ||
      !ggd->WriteDyndepFile(dir_top_src, dir_top_bld, dir_cur_src, dir_cur_bld,
                            arg_dd, arg_ddis, module_dir,
                            linked_target_dirs)) {
    return 1;
  }
  return 0;
}